

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-constant.h
# Opt level: O3

bool __thiscall
wasm::PossibleConstantValues::combine(PossibleConstantValues *this,PossibleConstantValues *other)

{
  __index_type _Var1;
  bool bVar2;
  long lVar3;
  _Storage<wasm::HeapType,_true> a;
  HeapType b;
  optional<wasm::HeapType> oVar4;
  anon_union_16_6_1532cd5a_for_Literal_0 local_40;
  Type local_30;
  undefined1 local_21 [8];
  bool __ret;
  
  lVar3 = (long)(char)*(__index_type *)
                       ((long)&(other->value).
                               super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                               .
                               super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                               .
                               super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                               .
                               super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                               .
                               super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                               .
                               super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                       + 0x18);
  if (lVar3 == 0) {
    return false;
  }
  _Var1 = *(__index_type *)
           ((long)&(this->value).
                   super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                   .
                   super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                   .
                   super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                   .
                   super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                   .
                   super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                   .
                   super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
           + 0x18);
  if (_Var1 != '\x03') {
    if (_Var1 == '\0') {
      local_40.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>_&>
        ::_S_vtable._M_arr[lVar3 + 1]._M_data)
                ((anon_class_8_1_8991fb9c_conflict5 *)&local_40,&other->value);
    }
    else {
      local_40.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_21;
      local_21[0] = '\x01';
      local_40.func.super_IString.str._M_str = (char *)other;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:1233:3)_&&,_const_std::variant<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>_&>
        ::_S_vtable._M_arr[(long)(char)_Var1 + 1]._M_data)
                ((anon_class_16_2_9763bfdf_conflict1 *)&local_40,&this->value);
      if (local_21[0] != '\x01') {
        bVar2 = isNull(this);
        if ((!bVar2) || (bVar2 = isNull(other), !bVar2)) {
          return false;
        }
        getConstantLiteral((Literal *)&local_40.func,this);
        a._M_value = wasm::Type::getHeapType(&local_30);
        Literal::~Literal((Literal *)&local_40.func);
        getConstantLiteral((Literal *)&local_40.func,other);
        b = wasm::Type::getHeapType(&local_30);
        Literal::~Literal((Literal *)&local_40.func);
        oVar4 = HeapType::getLeastUpperBound(a._M_value,b);
        if (((undefined1  [16])
             oVar4.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
            (undefined1  [16])0x0) {
          if (oVar4.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::HeapType>._M_payload == a) {
            return false;
          }
          Literal::makeNull((Literal *)&local_40.func,
                            oVar4.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::HeapType>._M_payload._M_value);
          std::
          variant<wasm::PossibleConstantValues::None,wasm::Literal,wasm::Name,wasm::PossibleConstantValues::Many>
          ::operator=((variant<wasm::PossibleConstantValues::None,wasm::Literal,wasm::Name,wasm::PossibleConstantValues::Many>
                       *)this,(Literal *)&local_40.func);
          Literal::~Literal((Literal *)&local_40.func);
          return true;
        }
      }
      std::
      variant<wasm::PossibleConstantValues::None,wasm::Literal,wasm::Name,wasm::PossibleConstantValues::Many>
      ::operator=((variant<wasm::PossibleConstantValues::None,wasm::Literal,wasm::Name,wasm::PossibleConstantValues::Many>
                   *)this,(Many *)&local_40.func);
    }
    return true;
  }
  return false;
}

Assistant:

bool combine(const PossibleConstantValues& other) {
    if (std::get_if<None>(&other.value)) {
      return false;
    }

    if (std::get_if<None>(&value)) {
      value = other.value;
      return true;
    }

    if (std::get_if<Many>(&value)) {
      return false;
    }

    if (other.value != value) {
      value = Many();
      return true;
    }

    // Nulls compare equal, and we could consider any of the input nulls as the
    // combination of the two (as any of them would be valid to place in the
    // location we are working to optimize). In order to have simple symmetric
    // behavior here, which does not depend on the order of the inputs, use the
    // LUB.
    if (isNull() && other.isNull()) {
      auto type = getConstantLiteral().type.getHeapType();
      auto otherType = other.getConstantLiteral().type.getHeapType();
      auto lub = HeapType::getLeastUpperBound(type, otherType);
      if (!lub) {
        // TODO: Remove this workaround once we have bottom types to assign to
        // null literals.
        value = Many();
        return true;
      }
      if (*lub != type) {
        value = Literal::makeNull(*lub);
        return true;
      }
      return false;
    }

    return false;
  }